

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

span<const_slang::ast::Expression_*const,_18446744073709551615UL>
slang::ast::bindMatchItems
          (SequenceMatchListSyntax *syntax,ASTContext *context,AssertionExpr *sequence)

{
  SourceRange *pSVar1;
  bool bVar2;
  int iVar3;
  ExpressionSyntax *pEVar4;
  undefined4 extraout_var;
  Expression *pEVar5;
  CallExpression *call;
  Diagnostic *this;
  Compilation *dst;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *src;
  const_iterator cVar6;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_208;
  SourceRange local_1f8;
  SourceRange local_1e8;
  DiagCode local_1d4;
  Diagnostic *local_1d0;
  Diagnostic *diag;
  SourceLocation SStack_1c0;
  undefined4 local_1b4;
  _Storage<slang::DiagCode,_true> local_1b0;
  uint local_1ac;
  SourceLocation local_1a8;
  SourceLocation SStack_1a0;
  _Storage<slang::DiagCode,_true> local_196;
  undefined2 local_192;
  DiagCode local_190;
  DiagCode local_18c;
  SourceLocation local_188;
  SourceLocation SStack_180;
  undefined4 local_16c;
  UnaryExpression *local_168;
  UnaryExpression *unary;
  AssignmentExpression *assign;
  bitmask<slang::ast::ASTFlags> local_150;
  AssignmentExpression *local_148;
  Expression *expr;
  ExpressionSyntax *local_138;
  ExpressionSyntax *exprSyn;
  PropertyExprSyntax *item_1;
  const_iterator __end2;
  undefined1 local_108 [8];
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *__range2;
  SmallVector<const_slang::ast::Expression_*,_5UL> results;
  PropertyExprSyntax *item;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *__range3;
  bitmask<slang::ast::ASTFlags> local_78;
  undefined1 local_70 [8];
  ASTContext ctx;
  anon_class_8_1_bc11688f checkLocalVar;
  AssertionExpr *sequence_local;
  ASTContext *context_local;
  SequenceMatchListSyntax *syntax_local;
  
  ctx.assertionInstance = (AssertionInstanceDetails *)context;
  memcpy(local_70,context,0x38);
  local_78 = operator~(AssignmentDisallowed);
  bitmask<slang::ast::ASTFlags>::operator&=
            ((bitmask<slang::ast::ASTFlags> *)&ctx.lookupIndex,&local_78);
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)&__range3,AssertionInstanceArgCheck);
  bVar2 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)&ctx.lookupIndex,
                     (bitmask<slang::ast::ASTFlags> *)&__range3);
  if (bVar2) {
    join_0x00000010_0x00000000_ =
         slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::begin
                   (&syntax->items);
    _item = slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::end
                      (&syntax->items);
    while (bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::iterator_base<const_slang::syntax::PropertyExprSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PropertyExprSyntax_*,_unsigned_long,_const_slang::syntax::PropertyExprSyntax_**,_const_slang::syntax::PropertyExprSyntax_*&>
                   ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::iterator_base<const_slang::syntax::PropertyExprSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PropertyExprSyntax_*,_unsigned_long,_const_slang::syntax::PropertyExprSyntax_**,_const_slang::syntax::PropertyExprSyntax_*&>
                                 *)&__end3.index,
                                (iterator_base<const_slang::syntax::PropertyExprSyntax_*> *)&item),
          bVar2) {
      results.stackBase._24_8_ =
           slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::
           iterator_base<const_slang::syntax::PropertyExprSyntax_*>::operator*
                     ((iterator_base<const_slang::syntax::PropertyExprSyntax_*> *)&__end3.index);
      AssertionExpr::bind((AssertionExpr *)results.stackBase._24_8_,(int)local_70,(sockaddr *)0x0,0)
      ;
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::iterator_base<const_slang::syntax::PropertyExprSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PropertyExprSyntax_*,_unsigned_long,_const_slang::syntax::PropertyExprSyntax_**,_const_slang::syntax::PropertyExprSyntax_*&>
      ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::iterator_base<const_slang::syntax::PropertyExprSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PropertyExprSyntax_*,_unsigned_long,_const_slang::syntax::PropertyExprSyntax_**,_const_slang::syntax::PropertyExprSyntax_*&>
                    *)&__end3.index);
    }
    nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
    span<true,_0>((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)&syntax_local
                 );
  }
  else {
    SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
              ((SmallVector<const_slang::ast::Expression_*,_5UL> *)&__range2);
    __begin2.index = (size_t)&syntax->items;
    cVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::begin
                      ((SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *)__begin2.index);
    __begin2.list = (ParentList *)cVar6.index;
    local_108 = (undefined1  [8])cVar6.list;
    cVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::end
                      ((SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *)__begin2.index);
    while( true ) {
      __end2.list = (ParentList *)cVar6.index;
      item_1 = (PropertyExprSyntax *)cVar6.list;
      bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::iterator_base<const_slang::syntax::PropertyExprSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PropertyExprSyntax_*,_unsigned_long,_const_slang::syntax::PropertyExprSyntax_**,_const_slang::syntax::PropertyExprSyntax_*&>
              ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::iterator_base<const_slang::syntax::PropertyExprSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PropertyExprSyntax_*,_unsigned_long,_const_slang::syntax::PropertyExprSyntax_**,_const_slang::syntax::PropertyExprSyntax_*&>
                            *)local_108,
                           (iterator_base<const_slang::syntax::PropertyExprSyntax_*> *)&item_1);
      if (!bVar2) break;
      exprSyn = (ExpressionSyntax *)
                slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::
                iterator_base<const_slang::syntax::PropertyExprSyntax_*>::operator*
                          ((iterator_base<const_slang::syntax::PropertyExprSyntax_*> *)local_108);
      expr._4_4_ = 0x200008;
      pEVar4 = ASTContext::requireSimpleExpr
                         (context,(PropertyExprSyntax *)exprSyn,(DiagCode)0x200008);
      local_138 = pEVar4;
      if (pEVar4 != (ExpressionSyntax *)0x0) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_150,AssignmentAllowed);
        iVar3 = Expression::bind((int)pEVar4,(sockaddr *)local_70,(socklen_t)local_150.m_bits);
        assign = (AssignmentExpression *)CONCAT44(extraout_var,iVar3);
        local_148 = assign;
        SmallVectorBase<const_slang::ast::Expression_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Expression_*> *)&__range2,
                   (Expression **)&assign);
        switch((local_148->super_Expression).kind) {
        case Invalid:
          break;
        default:
          local_1b4 = 0x200008;
          pSVar1 = &(local_148->super_Expression).sourceRange;
          diag = *(Diagnostic **)&pSVar1->startLoc;
          SStack_1c0 = (local_148->super_Expression).sourceRange.endLoc;
          ASTContext::addDiag(context,(DiagCode)0x200008,*pSVar1);
          break;
        case UnaryOp:
          local_168 = Expression::as<slang::ast::UnaryExpression>(&local_148->super_Expression);
          if (local_168->op - Preincrement < 4) {
            pEVar5 = UnaryExpression::operand(local_168);
            bindMatchItems::anon_class_8_1_bc11688f::operator()
                      ((anon_class_8_1_bc11688f *)&ctx.assertionInstance,pEVar5);
          }
          else {
            local_16c = 0x200008;
            pSVar1 = &(local_148->super_Expression).sourceRange;
            local_188 = pSVar1->startLoc;
            SStack_180 = (local_148->super_Expression).sourceRange.endLoc;
            ASTContext::addDiag(context,(DiagCode)0x200008,*pSVar1);
          }
          break;
        case Assignment:
          unary = (UnaryExpression *)
                  Expression::as<slang::ast::AssignmentExpression>(&local_148->super_Expression);
          pEVar5 = AssignmentExpression::left((AssignmentExpression *)unary);
          bindMatchItems::anon_class_8_1_bc11688f::operator()
                    ((anon_class_8_1_bc11688f *)&ctx.assertionInstance,pEVar5);
          break;
        case Call:
          call = Expression::as<slang::ast::CallExpression>(&local_148->super_Expression);
          local_18c.subsystem = Statements;
          local_18c.code = 0x43;
          local_190.subsystem = Statements;
          local_190.code = 0x42;
          std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)&local_196);
          pSVar1 = &(local_148->super_Expression).sourceRange;
          local_1a8 = pSVar1->startLoc;
          SStack_1a0 = (local_148->super_Expression).sourceRange.endLoc;
          local_1ac = CONCAT22(local_1ac._2_2_,local_192);
          local_1b0 = local_196;
          AssertionExpr::checkAssertionCall
                    (call,context,local_18c,local_190,
                     (optional<slang::DiagCode>)((uint6)(uint)local_196 | (uint6)local_1ac << 0x20),
                     *pSVar1);
        }
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::iterator_base<const_slang::syntax::PropertyExprSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PropertyExprSyntax_*,_unsigned_long,_const_slang::syntax::PropertyExprSyntax_**,_const_slang::syntax::PropertyExprSyntax_*&>
      ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::iterator_base<const_slang::syntax::PropertyExprSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PropertyExprSyntax_*,_unsigned_long,_const_slang::syntax::PropertyExprSyntax_**,_const_slang::syntax::PropertyExprSyntax_*&>
                    *)local_108);
      cVar6.index = (size_t)__end2.list;
      cVar6.list = (ParentList *)item_1;
    }
    bVar2 = AssertionExpr::admitsEmpty(sequence);
    if (bVar2) {
      local_1d4.subsystem = Statements;
      local_1d4.code = 0x26;
      local_1e8 = slang::syntax::SyntaxNode::sourceRange
                            (&(syntax->items).super_SyntaxListBase.super_SyntaxNode);
      this = ASTContext::addDiag(context,local_1d4,local_1e8);
      local_1d0 = this;
      if (sequence->syntax != (SyntaxNode *)0x0) {
        local_1f8 = slang::syntax::SyntaxNode::sourceRange(sequence->syntax);
        Diagnostic::operator<<(this,local_1f8);
      }
    }
    dst = ASTContext::getCompilation(context);
    iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      ((SmallVectorBase<const_slang::ast::Expression_*> *)&__range2,
                       (EVP_PKEY_CTX *)dst,src);
    local_208.data_ = (pointer)CONCAT44(extraout_var_00,iVar3);
    nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
    span<const_slang::ast::Expression_*,_18446744073709551615UL,_0>
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)&syntax_local,
               &local_208);
    SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::ast::Expression_*,_5UL> *)&__range2);
  }
  return _syntax_local;
}

Assistant:

static span<const Expression* const> bindMatchItems(const SequenceMatchListSyntax& syntax,
                                                    const ASTContext& context,
                                                    const AssertionExpr& sequence) {
    auto checkLocalVar = [&](const Expression& expr) {
        auto sym = expr.getSymbolReference();
        if (!sym || sym->kind != SymbolKind::LocalAssertionVar)
            context.addDiag(diag::LocalVarMatchItem, expr.sourceRange);
    };

    ASTContext ctx = context;
    ctx.flags &= ~ASTFlags::AssignmentDisallowed;

    // If we are creating an argument, these "match items" might actually be part of
    // a comma-separated event expression. We need to avoid erroring in that case.
    // Just do the bare minimum to check the expressions here.
    if (ctx.flags.has(ASTFlags::AssertionInstanceArgCheck)) {
        for (auto item : syntax.items)
            AssertionExpr::bind(*item, ctx);
        return {};
    }

    SmallVector<const Expression*> results;
    for (auto item : syntax.items) {
        auto exprSyn = context.requireSimpleExpr(*item, diag::InvalidMatchItem);
        if (!exprSyn)
            continue;

        auto& expr = Expression::bind(*exprSyn, ctx, ASTFlags::AssignmentAllowed);
        results.push_back(&expr);

        switch (expr.kind) {
            case ExpressionKind::Assignment: {
                auto& assign = expr.as<AssignmentExpression>();
                checkLocalVar(assign.left());
                break;
            }
            case ExpressionKind::UnaryOp: {
                auto& unary = expr.as<UnaryExpression>();
                switch (unary.op) {
                    case UnaryOperator::Preincrement:
                    case UnaryOperator::Predecrement:
                    case UnaryOperator::Postincrement:
                    case UnaryOperator::Postdecrement:
                        checkLocalVar(unary.operand());
                        break;
                    default:
                        context.addDiag(diag::InvalidMatchItem, expr.sourceRange);
                        break;
                }
                break;
            }
            case ExpressionKind::Call: {
                AssertionExpr::checkAssertionCall(expr.as<CallExpression>(), context,
                                                  diag::SubroutineMatchOutArg,
                                                  diag::SubroutineMatchAutoRefArg, std::nullopt,
                                                  expr.sourceRange);
                break;
            }
            case ExpressionKind::Invalid:
                break;
            default:
                context.addDiag(diag::InvalidMatchItem, expr.sourceRange);
                break;
        }
    }

    if (sequence.admitsEmpty()) {
        auto& diag = context.addDiag(diag::MatchItemsAdmitEmpty, syntax.items.sourceRange());
        if (sequence.syntax)
            diag << sequence.syntax->sourceRange();
    }

    return results.copy(context.getCompilation());
}